

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void FM_KEYON(FM_OPN *OPN,FM_CH *CH,int s)

{
  int iVar1;
  byte bVar2;
  UINT32 UVar3;
  
  if ((CH->SLOT[(uint)s].key != '\0') || (((OPN->SL3).key_csm != '\0' && (OPN->P_CH + 2 == CH))))
  goto LAB_00128860;
  CH->SLOT[(uint)s].phase = 0;
  CH->SLOT[(uint)s].ssgn = '\0';
  if ((uint)CH->SLOT[(uint)s].ksr + CH->SLOT[(uint)s].ar < 0x5e) {
    iVar1 = CH->SLOT[(uint)s].volume;
    bVar2 = 4;
    if (iVar1 < 1) goto LAB_0012882f;
  }
  else {
    CH->SLOT[(uint)s].volume = 0;
    iVar1 = 0;
LAB_0012882f:
    bVar2 = CH->SLOT[(uint)s].sl == 0 ^ 3;
  }
  CH->SLOT[(uint)s].state = bVar2;
  if ((~CH->SLOT[(uint)s].ssg & 0xc) == 0) {
    UVar3 = (0x200U - iVar1 & 0x3ff) + CH->SLOT[(uint)s].tl;
  }
  else {
    UVar3 = iVar1 + CH->SLOT[(uint)s].tl;
  }
  CH->SLOT[(uint)s].vol_out = UVar3;
LAB_00128860:
  CH->SLOT[(uint)s].key = '\x01';
  return;
}

Assistant:

INLINE void FM_KEYON(FM_OPN *OPN, FM_CH *CH , int s )
{
	FM_SLOT *SLOT = &CH->SLOT[s];

	// Note by Valley Bell:
	//  I assume that the CSM mode shouldn't affect channels
	//  other than FM3, so I added a check for it here.
	if( !SLOT->key && (!OPN->SL3.key_csm || CH != &OPN->P_CH[2]))
	{
		/* restart Phase Generator */
		SLOT->phase = 0;

		/* reset SSG-EG inversion flag */
		SLOT->ssgn = 0;

		if ((SLOT->ar + SLOT->ksr) < 94 /*32+62*/)
		{
			SLOT->state = (SLOT->volume <= MIN_ATT_INDEX) ? ((SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC) : EG_ATT;
		}
		else
		{
			/* force attenuation level to 0 */
			SLOT->volume = MIN_ATT_INDEX;

			/* directly switch to Decay (or Sustain) */
			SLOT->state = (SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC;
		}

		/* recalculate EG output */
		if ((SLOT->ssg&0x08) && (SLOT->ssgn ^ (SLOT->ssg&0x04)))
			SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
		else
			SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
	}

	SLOT->key = 1;
}